

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O1

void __thiscall spdlog::pattern_formatter::format(pattern_formatter *this,log_msg *msg)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  char *begin;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *f;
  pointer puVar3;
  tm tm_time;
  long local_68;
  tm local_60;
  
  if (this->_pattern_time == local) {
    local_68 = (msg->time).__d.__r / 1000000000;
    localtime_r(&local_68,&local_60);
  }
  else {
    local_68 = (msg->time).__d.__r / 1000000000;
    gmtime_r(&local_68,&local_60);
  }
  puVar3 = (this->_formatters).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_formatters).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      pfVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      (*pfVar2->_vptr_flag_formatter[2])(pfVar2,msg,&local_60);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  begin = (this->_eol)._M_dataplus._M_p;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,begin,
             begin + (this->_eol)._M_string_length);
  return;
}

Assistant:

inline void spdlog::pattern_formatter::format(details::log_msg &msg)
{

#ifndef SPDLOG_NO_DATETIME
    auto tm_time = get_time(msg);
#else
    std::tm tm_time;
#endif
    for (auto &f : _formatters)
    {
        f->format(msg, tm_time);
    }
    // write eol
    msg.formatted << _eol;
}